

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseTools.cpp
# Opt level: O0

void tonk::SetTonkAddressStr(TonkAddress *addrOut,UDPAddress *addrIn)

{
  bool bVar1;
  unsigned_short uVar2;
  ulong uVar3;
  undefined1 *puVar4;
  void *in_RDI;
  size_t i_1;
  size_t i;
  size_t slen;
  string addrstr;
  address ip_addr;
  basic_endpoint<asio::ip::udp> *in_stack_ffffffffffffff98;
  address *in_stack_ffffffffffffffa0;
  ulong uVar5;
  address *in_stack_ffffffffffffffa8;
  string local_50 [72];
  void *local_8;
  
  local_8 = in_RDI;
  uVar2 = asio::ip::basic_endpoint<asio::ip::udp>::port((basic_endpoint<asio::ip::udp> *)0x188448);
  *(unsigned_short *)((long)local_8 + 0x28) = uVar2;
  asio::ip::basic_endpoint<asio::ip::udp>::address(in_stack_ffffffffffffff98);
  bVar1 = asio::ip::address::is_unspecified(in_stack_ffffffffffffffa0);
  if (bVar1) {
    memset(local_8,0,0x28);
  }
  else {
    asio::ip::address::to_string_abi_cxx11_(in_stack_ffffffffffffffa8);
    uVar3 = std::__cxx11::string::size();
    if (0x27 < uVar3) {
      uVar3 = 0x27;
    }
    for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
      puVar4 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_50);
      *(undefined1 *)((long)local_8 + uVar5) = *puVar4;
    }
    for (; uVar3 < 0x28; uVar3 = uVar3 + 1) {
      *(undefined1 *)((long)local_8 + uVar3) = 0;
    }
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void SetTonkAddressStr(TonkAddress& addrOut, const UDPAddress& addrIn)
{
    addrOut.UDPPort = addrIn.port();

    const auto ip_addr = addrIn.address();
    if (ip_addr.is_unspecified())
    {
        memset(addrOut.NetworkString, 0, sizeof(addrOut.NetworkString));
        return;
    }

    const std::string addrstr = ip_addr.to_string();

    size_t slen = addrstr.size();
    if (slen > TONK_IP_STRING_MAX_CHARS)
        slen = TONK_IP_STRING_MAX_CHARS;
    static_assert(sizeof(addrOut.NetworkString) == TONK_IP_STRING_BYTES, "Update this");

    for (size_t i = 0; i < slen; ++i)
        addrOut.NetworkString[i] = addrstr[i];
    for (size_t i = slen; i < TONK_IP_STRING_BYTES; ++i)
        addrOut.NetworkString[i] = '\0';
}